

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::RawProgramWrapper::writeToLog
          (RawProgramWrapper *this,TestLog *log)

{
  pointer pcVar1;
  qpShaderType type;
  string info;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  string local_c8;
  bool local_a8;
  long *local_a0 [2];
  long local_90 [2];
  LogShader local_80;
  
  pcVar1 = (this->m_program).m_info.infoLog._M_dataplus._M_p;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + (this->m_program).m_info.infoLog._M_string_length);
  type = glu::getLogShaderType(this->m_shaderType);
  local_a8 = true;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char*>((string *)local_a0,local_e8,local_e0 + (long)local_e8);
  tcu::TestLog::startShaderProgram(log,local_a8,(char *)local_a0[0]);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"[Shader created by glCreateShaderProgramv()]","");
  tcu::LogShader::LogShader(&local_80,type,&this->m_source,true,&local_c8);
  tcu::TestLog::writeShader
            (log,local_80.m_type,local_80.m_source._M_dataplus._M_p,local_80.m_compileOk,
             local_80.m_infoLog._M_dataplus._M_p);
  tcu::TestLog::endShaderProgram(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_infoLog._M_dataplus._M_p != &local_80.m_infoLog.field_2) {
    operator_delete(local_80.m_infoLog._M_dataplus._M_p,
                    local_80.m_infoLog.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_source._M_dataplus._M_p != &local_80.m_source.field_2) {
    operator_delete(local_80.m_source._M_dataplus._M_p,
                    local_80.m_source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  return;
}

Assistant:

void RawProgramWrapper::writeToLog (TestLog& log)
{
	const string	info	= m_program.getInfoLog();
	qpShaderType	qpType	= glu::getLogShaderType(m_shaderType);

	log << TestLog::ShaderProgram(true, info)
		<< TestLog::Shader(qpType, m_source,
						   true, "[Shader created by glCreateShaderProgramv()]")
		<< TestLog::EndShaderProgram;
}